

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void set_bitstream_level_tier(AV1_PRIMARY *ppi,int width,int height,double init_framerate)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int64_t iVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  int i;
  AV1_LEVEL level;
  AV1LevelParams *level_params;
  SequenceHeader *seq_params;
  byte local_34;
  int local_30;
  byte local_29;
  
  lVar2 = in_RDI + 0xbfb8;
  lVar3 = in_RDI + 0x5a90;
  local_29 = 0x1f;
  iVar1 = does_level_match(in_ESI,in_EDX,in_XMM0_Qa,0x200,0x120,30.0,4);
  if (iVar1 == 0) {
    iVar1 = does_level_match(in_ESI,in_EDX,in_XMM0_Qa,0x2c0,0x18c,30.0,4);
    if (iVar1 == 0) {
      iVar1 = does_level_match(in_ESI,in_EDX,in_XMM0_Qa,0x440,0x264,30.0,4);
      if (iVar1 == 0) {
        iVar1 = does_level_match(in_ESI,in_EDX,in_XMM0_Qa,0x560,0x306,30.0,4);
        if (iVar1 == 0) {
          iVar1 = does_level_match(in_ESI,in_EDX,in_XMM0_Qa,0x800,0x480,30.0,3);
          if (iVar1 == 0) {
            iVar1 = does_level_match(in_ESI,in_EDX,in_XMM0_Qa,0x800,0x480,60.0,3);
            if (iVar1 == 0) {
              iVar1 = does_level_match(in_ESI,in_EDX,in_XMM0_Qa,0x1000,0x880,30.0,2);
              if (iVar1 == 0) {
                iVar1 = does_level_match(in_ESI,in_EDX,in_XMM0_Qa,0x1000,0x880,60.0,2);
                if (iVar1 == 0) {
                  iVar1 = does_level_match(in_ESI,in_EDX,in_XMM0_Qa,0x1000,0x880,120.0,2);
                  if (iVar1 == 0) {
                    iVar1 = does_level_match(in_ESI,in_EDX,in_XMM0_Qa,0x2000,0x1100,30.0,2);
                    if (iVar1 == 0) {
                      iVar1 = does_level_match(in_ESI,in_EDX,in_XMM0_Qa,0x2000,0x1100,60.0,2);
                      if (iVar1 == 0) {
                        iVar1 = does_level_match(in_ESI,in_EDX,in_XMM0_Qa,0x2000,0x1100,120.0,2);
                        if (iVar1 != 0) {
                          local_29 = 0x12;
                        }
                      }
                      else {
                        local_29 = 0x11;
                      }
                    }
                    else {
                      local_29 = 0x10;
                    }
                  }
                  else {
                    local_29 = 0xe;
                  }
                }
                else {
                  local_29 = 0xd;
                }
              }
              else {
                local_29 = 0xc;
              }
            }
            else {
              local_29 = 9;
            }
          }
          else {
            local_29 = 8;
          }
        }
        else {
          local_29 = 5;
        }
      }
      else {
        local_29 = 4;
      }
    }
    else {
      local_29 = 1;
    }
  }
  else {
    local_29 = 0;
  }
  for (local_30 = 0; local_30 < 0x20; local_30 = local_30 + 1) {
    if ((*(byte *)(lVar3 + local_30) < 0x1c) && (local_29 < *(byte *)(lVar3 + local_30))) {
      local_34 = *(byte *)(lVar3 + local_30);
    }
    else {
      local_34 = local_29;
    }
    *(byte *)(in_RDI + 0xc0d9 + (long)local_30) = local_34;
    iVar4 = av1_max_level_bitrate
                      (*(BITSTREAM_PROFILE *)(in_RDI + 0xbffd),
                       (uint)*(byte *)(in_RDI + 0xc0d9 + (long)local_30),
                       (uint)*(byte *)(in_RDI + 0xc0f9 + (long)local_30));
    *(int64_t *)(lVar2 + (long)local_30 * 0x30 + 0x170) = iVar4;
    if (*(long *)(lVar2 + (long)local_30 * 0x30 + 0x170) == 0) {
      aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_UNSUP_BITSTREAM,
                         "AV1 does not support this combination of profile, level, and tier.");
    }
    *(undefined8 *)(lVar2 + (long)local_30 * 0x30 + 0x178) =
         *(undefined8 *)(lVar2 + (long)local_30 * 0x30 + 0x170);
  }
  return;
}

Assistant:

static void set_bitstream_level_tier(AV1_PRIMARY *const ppi, int width,
                                     int height, double init_framerate) {
  SequenceHeader *const seq_params = &ppi->seq_params;
  const AV1LevelParams *const level_params = &ppi->level_params;
  // TODO(any): This is a placeholder function that only addresses dimensions
  // and max display sample rates.
  // Need to add checks for max bit rate, max decoded luma sample rate, header
  // rate, etc. that are not covered by this function.
  AV1_LEVEL level = SEQ_LEVEL_MAX;
  if (does_level_match(width, height, init_framerate, 512, 288, 30.0, 4)) {
    level = SEQ_LEVEL_2_0;
  } else if (does_level_match(width, height, init_framerate, 704, 396, 30.0,
                              4)) {
    level = SEQ_LEVEL_2_1;
  } else if (does_level_match(width, height, init_framerate, 1088, 612, 30.0,
                              4)) {
    level = SEQ_LEVEL_3_0;
  } else if (does_level_match(width, height, init_framerate, 1376, 774, 30.0,
                              4)) {
    level = SEQ_LEVEL_3_1;
  } else if (does_level_match(width, height, init_framerate, 2048, 1152, 30.0,
                              3)) {
    level = SEQ_LEVEL_4_0;
  } else if (does_level_match(width, height, init_framerate, 2048, 1152, 60.0,
                              3)) {
    level = SEQ_LEVEL_4_1;
  } else if (does_level_match(width, height, init_framerate, 4096, 2176, 30.0,
                              2)) {
    level = SEQ_LEVEL_5_0;
  } else if (does_level_match(width, height, init_framerate, 4096, 2176, 60.0,
                              2)) {
    level = SEQ_LEVEL_5_1;
  } else if (does_level_match(width, height, init_framerate, 4096, 2176, 120.0,
                              2)) {
    level = SEQ_LEVEL_5_2;
  } else if (does_level_match(width, height, init_framerate, 8192, 4352, 30.0,
                              2)) {
    level = SEQ_LEVEL_6_0;
  } else if (does_level_match(width, height, init_framerate, 8192, 4352, 60.0,
                              2)) {
    level = SEQ_LEVEL_6_1;
  } else if (does_level_match(width, height, init_framerate, 8192, 4352, 120.0,
                              2)) {
    level = SEQ_LEVEL_6_2;
  }
#if CONFIG_CWG_C013
  // TODO(bohanli): currently target level is only working for the 0th operating
  // point, so scalable coding is not supported.
  else if (level_params->target_seq_level_idx[0] >= SEQ_LEVEL_7_0 &&
           level_params->target_seq_level_idx[0] <= SEQ_LEVEL_8_3) {
    // Only use level 7.x to 8.x when explicitly asked to.
    if (does_level_match(width, height, init_framerate, 16384, 8704, 30.0, 2)) {
      level = SEQ_LEVEL_7_0;
    } else if (does_level_match(width, height, init_framerate, 16384, 8704,
                                60.0, 2)) {
      level = SEQ_LEVEL_7_1;
    } else if (does_level_match(width, height, init_framerate, 16384, 8704,
                                120.0, 2)) {
      level = SEQ_LEVEL_7_2;
    } else if (does_level_match(width, height, init_framerate, 32768, 17408,
                                30.0, 2)) {
      level = SEQ_LEVEL_8_0;
    } else if (does_level_match(width, height, init_framerate, 32768, 17408,
                                60.0, 2)) {
      level = SEQ_LEVEL_8_1;
    } else if (does_level_match(width, height, init_framerate, 32768, 17408,
                                120.0, 2)) {
      level = SEQ_LEVEL_8_2;
    }
  }
#endif

  for (int i = 0; i < MAX_NUM_OPERATING_POINTS; ++i) {
    assert(is_valid_seq_level_idx(level_params->target_seq_level_idx[i]) ||
           level_params->target_seq_level_idx[i] == SEQ_LEVEL_KEEP_STATS);
    // If a higher target level is specified, it is then used rather than the
    // inferred one from resolution and framerate.
    seq_params->seq_level_idx[i] =
        level_params->target_seq_level_idx[i] < SEQ_LEVELS &&
                level_params->target_seq_level_idx[i] > level
            ? level_params->target_seq_level_idx[i]
            : level;
    // Set the maximum parameters for bitrate and buffer size for this profile,
    // level, and tier
    seq_params->op_params[i].bitrate = av1_max_level_bitrate(
        seq_params->profile, seq_params->seq_level_idx[i], seq_params->tier[i]);
    // Level with seq_level_idx = 31 returns a high "dummy" bitrate to pass the
    // check
    if (seq_params->op_params[i].bitrate == 0)
      aom_internal_error(
          &ppi->error, AOM_CODEC_UNSUP_BITSTREAM,
          "AV1 does not support this combination of profile, level, and tier.");
    // Buffer size in bits/s is bitrate in bits/s * 1 s
    seq_params->op_params[i].buffer_size = seq_params->op_params[i].bitrate;
  }
}